

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

uchar * DecompressData(uchar *compData,int compDataLength,int *dataLength)

{
  int iVar1;
  uchar *out;
  uchar *puVar2;
  
  out = (uchar *)calloc(0x4000000,1);
  iVar1 = sinfl_decompress(out,compData,compDataLength);
  puVar2 = (uchar *)realloc(out,(long)iVar1);
  if (puVar2 == (uchar *)0x0) {
    TraceLog(4,"SYSTEM: Failed to re-allocate required decompression memory");
    puVar2 = out;
  }
  *dataLength = iVar1;
  TraceLog(3,"SYSTEM: Decompress data: Comp. size: %i -> Original size: %i",compDataLength,
           dataLength);
  return puVar2;
}

Assistant:

unsigned char *DecompressData(unsigned char *compData, int compDataLength, int *dataLength)
{
    unsigned char *data = NULL;

#if defined(SUPPORT_COMPRESSION_API)
    // Decompress data from a valid DEFLATE stream
    data = RL_CALLOC(MAX_DECOMPRESSION_SIZE*1024*1024, 1);
    int length = sinflate(data, compData, compDataLength);
    unsigned char *temp = RL_REALLOC(data, length);

    if (temp != NULL) data = temp;
    else TRACELOG(LOG_WARNING, "SYSTEM: Failed to re-allocate required decompression memory");

    *dataLength = length;

    TraceLog(LOG_INFO, "SYSTEM: Decompress data: Comp. size: %i -> Original size: %i", compDataLength, dataLength);
#endif

    return data;
}